

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

StringPtr capnp::compiler::getExpressionTargetName(Reader exp)

{
  Reader exp_00;
  undefined2 uVar1;
  ArrayPtr<const_char> AVar2;
  undefined8 unaff_retaddr;
  SegmentReader *in_stack_00000008;
  CapTableReader *in_stack_00000010;
  undefined2 *in_stack_00000018;
  WirePointer *in_stack_00000020;
  uint in_stack_00000028;
  ushort in_stack_0000002c;
  undefined2 in_stack_0000002e;
  int in_stack_00000030;
  StructReader local_98;
  PointerReader local_68;
  StructReader local_48;
  
  if (in_stack_00000028 < 0x10) {
    uVar1 = 0;
  }
  else {
    uVar1 = *in_stack_00000018;
  }
  AVar2.size_ = 1;
  AVar2.ptr = "";
  switch(uVar1) {
  case 5:
  case 0xb:
    local_68.segment = in_stack_00000008;
    local_68.capTable = in_stack_00000010;
    local_68.pointer = in_stack_00000020;
    local_68.nestingLimit = in_stack_00000030;
    if (in_stack_0000002c == 0) {
      local_68.capTable = (CapTableReader *)0x0;
      local_68.pointer = (WirePointer *)0x0;
      local_68.segment = (SegmentReader *)0x0;
      local_68.nestingLimit = 0x7fffffff;
    }
    break;
  default:
    goto switchD_0044d7ee_caseD_6;
  case 9:
    local_98.capTable = in_stack_00000010;
    local_98.data = in_stack_00000020;
    local_98.segment = in_stack_00000008;
    if (in_stack_0000002c == 0) {
      in_stack_00000030 = 0x7fffffff;
      local_98.capTable = (CapTableReader *)0x0;
      local_98.data = (WirePointer *)0x0;
      local_98.segment = (SegmentReader *)0x0;
    }
    local_98.pointers._0_4_ = in_stack_00000030;
    capnp::_::PointerReader::getStruct(&local_48,(PointerReader *)&local_98,(word *)0x0);
    exp_00._reader.capTable = (CapTableReader *)in_stack_00000008;
    exp_00._reader.segment = (SegmentReader *)unaff_retaddr;
    exp_00._reader.data = in_stack_00000010;
    exp_00._reader.pointers = (WirePointer *)in_stack_00000018;
    exp_00._reader._32_8_ = in_stack_00000020;
    exp_00._reader.nestingLimit = in_stack_00000028;
    exp_00._reader._44_2_ = in_stack_0000002c;
    exp_00._reader._46_2_ = in_stack_0000002e;
    AVar2 = (ArrayPtr<const_char>)getExpressionTargetName(exp_00);
    return (StringPtr)AVar2;
  case 10:
    if (in_stack_0000002c < 2) {
      local_68.capTable = (CapTableReader *)0x0;
      local_68.pointer = (WirePointer *)0x0;
      local_68.segment = (SegmentReader *)0x0;
      local_68.nestingLimit = 0x7fffffff;
    }
    else {
      local_68.pointer = in_stack_00000020 + 1;
      local_68.segment = in_stack_00000008;
      local_68.capTable = in_stack_00000010;
      local_68.nestingLimit = in_stack_00000030;
    }
  }
  capnp::_::PointerReader::getStruct(&local_98,&local_68,(word *)0x0);
  local_68.pointer = (WirePointer *)0x0;
  local_68.segment = (SegmentReader *)0x0;
  local_68.capTable = (CapTableReader *)0x0;
  local_68.nestingLimit = 0x7fffffff;
  if (local_98.pointerCount != 0) {
    local_68.pointer = (WirePointer *)CONCAT44(local_98.pointers._4_4_,(int)local_98.pointers);
    local_68.segment = local_98.segment;
    local_68.capTable = local_98.capTable;
    local_68.nestingLimit = local_98.nestingLimit;
  }
  AVar2 = (ArrayPtr<const_char>)
          capnp::_::PointerReader::getBlob<capnp::Text>(&local_68,(void *)0x0,0);
switchD_0044d7ee_caseD_6:
  return (StringPtr)AVar2;
}

Assistant:

static kj::StringPtr getExpressionTargetName(Expression::Reader exp) {
  kj::StringPtr targetName;
  switch (exp.which()) {
    case Expression::ABSOLUTE_NAME:
      return exp.getAbsoluteName().getValue();
    case Expression::RELATIVE_NAME:
      return exp.getRelativeName().getValue();
    case Expression::APPLICATION:
      return getExpressionTargetName(exp.getApplication().getFunction());
    case Expression::MEMBER:
      return exp.getMember().getName().getValue();
    default:
      return nullptr;
  }
}